

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::state_update_alert::~state_update_alert(state_update_alert *this)

{
  state_update_alert *this_local;
  
  ~state_update_alert(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

struct TORRENT_EXPORT state_update_alert final : alert
	{
		state_update_alert(aux::stack_allocator& alloc
			, std::vector<torrent_status> st);

		TORRENT_DEFINE_ALERT_PRIO(state_update_alert, 68, alert_priority_high)

		static constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;

		// contains the torrent status of all torrents that changed since last
		// time this message was posted. Note that you can map a torrent status
		// to a specific torrent via its ``handle`` member. The receiving end is
		// suggested to have all torrents sorted by the torrent_handle or hashed
		// by it, for efficient updates.
		std::vector<torrent_status> status;
	}